

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

int QStyleHelper::calcBigLineSize(int radius)

{
  int bigLineSize;
  int radius_local;
  
  bigLineSize = radius / 6;
  if (bigLineSize < 4) {
    bigLineSize = 4;
  }
  if (radius / 2 < bigLineSize) {
    bigLineSize = radius / 2;
  }
  return bigLineSize;
}

Assistant:

int calcBigLineSize(int radius)
{
    int bigLineSize = radius / 6;
    if (bigLineSize < 4)
        bigLineSize = 4;
    if (bigLineSize > radius / 2)
        bigLineSize = radius / 2;
    return bigLineSize;
}